

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O1

DecimalQuantity * __thiscall
icu_63::number::impl::DecimalQuantity::operator=(DecimalQuantity *this,DecimalQuantity *other)

{
  if (this != other) {
    copyBcdFrom(this,other);
    this->bogus = other->bogus;
    this->lOptPos = other->lOptPos;
    this->lReqPos = other->lReqPos;
    this->rReqPos = other->rReqPos;
    this->rOptPos = other->rOptPos;
    this->scale = other->scale;
    this->precision = other->precision;
    this->flags = other->flags;
    this->origDouble = other->origDouble;
    this->origDelta = other->origDelta;
    this->isApproximate = other->isApproximate;
  }
  return this;
}

Assistant:

DecimalQuantity &DecimalQuantity::operator=(const DecimalQuantity &other) {
    if (this == &other) {
        return *this;
    }
    copyBcdFrom(other);
    copyFieldsFrom(other);
    return *this;
}